

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_Constractor_hex33_Test::TestBody(ConfidentialValue_Constractor_hex33_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  undefined1 extraout_DL;
  AssertHelper local_170;
  Message local_168;
  int local_15c;
  undefined8 local_158;
  undefined1 local_150;
  undefined8 local_148;
  undefined1 local_140;
  long local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_3;
  Message local_118;
  bool local_10a;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0;
  int local_e4;
  ByteData local_e0;
  unsigned_long local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  string local_a0 [32];
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  ConfidentialValue value;
  ConfidentialValue_Constractor_hex33_Test *this_local;
  
  value._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,"09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226",&local_59
            );
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_38,local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_80,"value.GetHex().c_str()",
             "\"09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226\"",pcVar3,
             "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  std::__cxx11::string::~string(local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x40,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  cfd::core::ConfidentialValue::GetData();
  local_c8 = cfd::core::ByteData::GetDataSize();
  local_e4 = 0x21;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_c0,"value.GetData().GetDataSize()","33",&local_c8,&local_e4);
  cfd::core::ByteData::~ByteData(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  bVar2 = cfd::core::ConfidentialValue::HasBlinding();
  local_109 = (bool)(bVar2 & 1);
  local_10a = true;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_108,"value.HasBlinding()","true",&local_109,&local_10a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_158 = cfd::core::ConfidentialValue::GetAmount();
  local_150 = extraout_DL;
  local_148 = local_158;
  local_140 = extraout_DL;
  local_138 = cfd::core::Amount::GetSatoshiValue();
  local_15c = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_130,"value.GetAmount().GetSatoshiValue()","0",&local_138,
             &local_15c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)local_38);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_hex33) {
  // 33byte
  ConfidentialValue value(
      "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  EXPECT_STREQ(
      value.GetHex().c_str(),
      "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  EXPECT_EQ(value.GetData().GetDataSize(), 33);
  EXPECT_EQ(value.HasBlinding(), true);
  EXPECT_EQ(value.GetAmount().GetSatoshiValue(), 0);
}